

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::FloorDouble(double d,ScriptContext *scriptContext)

{
  BOOL BVar1;
  Var pvVar2;
  long nValue;
  undefined8 in_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  double value;
  undefined1 auVar5 [16];
  
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = d;
  auVar4 = roundsd(in_XMM1,auVar3,9);
  auVar4._0_8_ = auVar4._0_8_ & -(ulong)(d < 0.0);
  auVar4._8_8_ = 0;
  auVar5._0_8_ = ~-(ulong)(d < 0.0) & (ulong)d;
  auVar5._8_8_ = in_XMM0_Qb;
  value = SUB168(auVar5 | auVar4,0);
  nValue = (long)value;
  if ((int)nValue == nValue) {
    BVar1 = JavascriptNumber::IsNegZero(value);
    auVar3 = extraout_XMM0;
    if (BVar1 == 0) {
      pvVar2 = JavascriptNumber::ToVar(nValue,scriptContext);
      return pvVar2;
    }
  }
  auVar3 = roundsd(auVar3,auVar5 | auVar4,9);
  pvVar2 = JavascriptNumber::ToVarNoCheck(auVar3._0_8_,scriptContext);
  return pvVar2;
}

Assistant:

Var inline Math::FloorDouble(double d, ScriptContext *scriptContext)
    {
            // xplat-todo: use intrinsics here on linux
#ifdef _MSC_VER
#if defined(_M_IX86) || defined(_M_X64)
        if (AutoSystemInfo::Data.SSE4_1Available())
        {
            __m128d input, output;

            int intResult;

            input = _mm_load_sd(&d);
            if (d >= 0.0)
            {
                output = input;
            }
            else
            {
                output = _mm_floor_sd(input, input);
            }
            intResult = _mm_cvttsd_si32(output);

            if (TaggedInt::IsOverflow(intResult) || intResult == 0x80000000 || JavascriptNumber::IsNegZero(d))
            {
                double dblResult;
                if (d >= 0.0)
                {
                    output = _mm_floor_sd(output, input);
                }
                _mm_store_sd(&dblResult, output);

                Assert(dblResult == ::floor(d) || Js::JavascriptNumber::IsNan(dblResult));

                return JavascriptNumber::ToVarNoCheck(dblResult, scriptContext);
            }
            else
            {
                Assert(intResult == (int)::floor(d));
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
        else
#endif
#endif
        {
            intptr_t intResult;

            if (d >= 0.0)
            {
                intResult = (intptr_t)d;
            }
            else
            {
                d = ::floor(d);
                intResult = (intptr_t)d;
            }

            if (TaggedInt::IsOverflow(intResult) || JavascriptNumber::IsNegZero(d))
            {
                return JavascriptNumber::ToVarNoCheck(::floor(d), scriptContext);
            }
            else
            {
                return JavascriptNumber::ToVar(intResult, scriptContext);
            }
        }
    }